

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O3

SQRELEASEHOOK sq_getreleasehook(HSQUIRRELVM v,SQInteger idx)

{
  SQObjectType SVar1;
  SQObjectPtr *pSVar2;
  long lVar3;
  
  if (idx < 0) {
    pSVar2 = SQVM::GetUp(v,idx);
  }
  else {
    pSVar2 = SQVM::GetAt(v,idx + v->_stackbase + -1);
  }
  SVar1 = (pSVar2->super_SQObject)._type;
  if (SVar1 == OT_CLASS) {
    lVar3 = 0x1a8;
  }
  else if (SVar1 == OT_USERDATA) {
    lVar3 = 0x40;
  }
  else {
    if (SVar1 != OT_INSTANCE) {
      return (SQRELEASEHOOK)0x0;
    }
    lVar3 = 0x48;
  }
  return *(SQRELEASEHOOK *)
          ((long)&(((pSVar2->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                  super_SQRefCounted._vptr_SQRefCounted + lVar3);
}

Assistant:

SQRELEASEHOOK sq_getreleasehook(HSQUIRRELVM v,SQInteger idx)
{
    SQObjectPtr &ud=stack_get(v,idx);
    switch(sq_type(ud) ) {
    case OT_USERDATA:   return _userdata(ud)->_hook;    break;
    case OT_INSTANCE:   return _instance(ud)->_hook;    break;
    case OT_CLASS:      return _class(ud)->_hook;       break;
    default: return NULL;
    }
}